

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MockCallTest.cpp
# Opt level: O0

void __thiscall
TEST_MockCallTest_OnObjectIgnored_MatchingAlreadyWhenObjectPassed_Test::testBody
          (TEST_MockCallTest_OnObjectIgnored_MatchingAlreadyWhenObjectPassed_Test *this)

{
  int iVar1;
  MockSupport *pMVar2;
  undefined4 extraout_var;
  SimpleString local_68;
  SimpleString local_58;
  SimpleString local_48 [2];
  SimpleString local_28;
  undefined8 local_18;
  void *objectPtr;
  TEST_MockCallTest_OnObjectIgnored_MatchingAlreadyWhenObjectPassed_Test *this_local;
  
  local_18 = 1;
  objectPtr = this;
  SimpleString::SimpleString(&local_28,"");
  pMVar2 = mock(&local_28,(MockFailureReporter *)0x0);
  SimpleString::SimpleString(local_48,"boo");
  (*pMVar2->_vptr_MockSupport[3])(pMVar2,local_48);
  SimpleString::~SimpleString(local_48);
  SimpleString::~SimpleString(&local_28);
  SimpleString::SimpleString(&local_58,"");
  pMVar2 = mock(&local_58,(MockFailureReporter *)0x0);
  SimpleString::SimpleString(&local_68,"boo");
  iVar1 = (*pMVar2->_vptr_MockSupport[6])(pMVar2,&local_68);
  (**(code **)(*(long *)CONCAT44(extraout_var,iVar1) + 0x170))
            ((long *)CONCAT44(extraout_var,iVar1),local_18);
  SimpleString::~SimpleString(&local_68);
  SimpleString::~SimpleString(&local_58);
  return;
}

Assistant:

TEST(MockCallTest, OnObjectIgnored_MatchingAlreadyWhenObjectPassed)
{
    void* objectPtr = (void*) 0x001;
    mock().expectOneCall("boo");
    mock().actualCall("boo").onObject(objectPtr);
}